

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

void Fossilize::remove_extension(char **active_extensions,size_t *out_extension_count,char *ext)

{
  ulong uVar1;
  int iVar2;
  ulong local_30;
  size_t i;
  size_t count;
  char *ext_local;
  size_t *out_extension_count_local;
  char **active_extensions_local;
  
  uVar1 = *out_extension_count;
  local_30 = 0;
  do {
    i = uVar1;
    if (uVar1 <= local_30) {
LAB_00127fa1:
      *out_extension_count = i;
      return;
    }
    iVar2 = strcmp(active_extensions[local_30],ext);
    if (iVar2 == 0) {
      i = uVar1 - 1;
      active_extensions[local_30] = active_extensions[uVar1 - 1];
      goto LAB_00127fa1;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static void remove_extension(const char **active_extensions, size_t *out_extension_count, const char *ext)
{
	size_t count = *out_extension_count;
	for (size_t i = 0; i < count; i++)
	{
		if (strcmp(active_extensions[i], ext) == 0)
		{
			active_extensions[i] = active_extensions[--count];
			break;
		}
	}

	*out_extension_count = count;
}